

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.h
# Opt level: O0

void __thiscall winmd::reader::database::initialize(database *this)

{
  uint8_t **this_00;
  ushort uVar1;
  int iVar2;
  bool bVar3;
  uint8_t c;
  uint8_t uVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  uint8_t b;
  uint8_t a;
  uint8_t c_00;
  uint8_t a_00;
  uint8_t b_00;
  uint8_t e;
  uint8_t b_01;
  uint8_t a_01;
  uint8_t c_01;
  uint8_t uVar7;
  image_dos_header *__src;
  image_nt_headers32 *__src_00;
  image_nt_headers32plus *__src_01;
  image_cor20_header *__src_02;
  uint *puVar8;
  unsigned_short *puVar9;
  stream_range *psVar10;
  array<char,_12UL> *paVar11;
  pointer pvVar12;
  byte *pbVar13;
  unsigned_long *puVar14;
  uint8_t TypeOrMethodDef;
  uint8_t ResolutionScope;
  uint8_t CustomAttributeType;
  uint8_t Implementation;
  uint8_t MemberForwarded;
  uint8_t MethodDefOrRef;
  uint8_t HasSemantics;
  uint8_t MemberRefParent;
  uint8_t HasDeclSecurity;
  uint8_t HasFieldMarshal;
  uint8_t HasCustomAttribute;
  uint8_t HasConstant;
  uint8_t TypeDefOrRef;
  table_base empty_table;
  string local_5d0;
  byte_view local_5b0;
  uint local_5a0;
  uint local_59c;
  uint row_count;
  uint32_t i_1;
  bitset<64UL> local_588;
  bitset<64UL> valid_bits;
  uint8_t blob_index_size;
  uint8_t guid_index_size;
  uint8_t string_index_size;
  bitset<8UL> heap_sizes;
  byte_view local_560;
  allocator<char> local_549;
  string local_548;
  basic_string_view<char,_std::char_traits<char>_> local_528;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_518;
  byte_view local_508;
  basic_string_view<char,_std::char_traits<char>_> local_4f8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_4e8;
  byte_view local_4d8;
  basic_string_view<char,_std::char_traits<char>_> local_4c8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_4b8;
  byte_view local_4a8;
  basic_string_view<char,_std::char_traits<char>_> local_498;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_488;
  byte_view local_478;
  basic_string_view<char,_std::char_traits<char>_> local_468;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_458;
  undefined1 local_448 [8];
  array<char,_12UL> name;
  stream_range stream;
  uint16_t i;
  byte_view tables;
  byte_view view;
  unsigned_short stream_count;
  uint version_length;
  allocator<char> local_3d9;
  string local_3d8;
  allocator<char> local_3b1;
  string local_3b0;
  int local_390 [2];
  image_cor20_header cli;
  uint32_t offset;
  image_section_header *local_320;
  image_section_header *section;
  image_section_header *sections_end;
  string local_308;
  undefined1 local_2e8 [8];
  image_nt_headers32plus pe_plus;
  image_section_header *piStack_1d8;
  uint32_t com_virtual_address;
  image_section_header *sections;
  string local_1c8;
  undefined1 local_1a4 [6];
  ushort local_19e;
  image_nt_headers32 pe;
  allocator<char> local_99;
  string local_98;
  short local_78 [4];
  image_dos_header dos;
  database *this_local;
  
  dos._56_8_ = this;
  __src = byte_view::as<winmd::impl::image_dos_header>(&(this->m_view).super_byte_view,0);
  memcpy(local_78,__src,0x40);
  if (local_78[0] != 0x5a4d) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"Invalid DOS signature",&local_99);
    impl::throw_invalid(&local_98);
  }
  __src_00 = byte_view::as<winmd::impl::image_nt_headers32>
                       (&(this->m_view).super_byte_view,dos.e_res2._12_4_);
  memcpy(local_1a4,__src_00,0xf8);
  if ((local_19e == 0) || (100 < local_19e)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,"Invalid PE section count",
               (allocator<char> *)((long)&sections + 7));
    impl::throw_invalid(&local_1c8);
  }
  pe_plus.OptionalHeader.DataDirectory[0xf].Size = 0;
  if ((short)pe.FileHeader.NumberOfSymbols == 0x10b) {
    pe_plus.OptionalHeader.DataDirectory[0xf].Size =
         pe.OptionalHeader.DataDirectory[0xd].VirtualAddress;
    piStack_1d8 = byte_view::as<winmd::impl::image_section_header>
                            (&(this->m_view).super_byte_view,dos.e_res2._12_4_ + 0xf8);
  }
  else {
    if ((short)pe.FileHeader.NumberOfSymbols != 0x20b) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_308,"Invalid optional header magic value",
                 (allocator<char> *)((long)&sections_end + 7));
      impl::throw_invalid(&local_308);
    }
    __src_01 = byte_view::as<winmd::impl::image_nt_headers32plus>
                         (&(this->m_view).super_byte_view,dos.e_res2._12_4_);
    memcpy(local_2e8,__src_01,0x108);
    pe_plus.OptionalHeader.DataDirectory[0xf].Size =
         pe_plus.OptionalHeader.DataDirectory[0xd].VirtualAddress;
    piStack_1d8 = byte_view::as<winmd::impl::image_section_header>
                            (&(this->m_view).super_byte_view,dos.e_res2._12_4_ + 0x108);
  }
  section = piStack_1d8 + (int)(uint)local_19e;
  local_320 = section_from_rva(piStack_1d8,section,pe_plus.OptionalHeader.DataDirectory[0xf].Size);
  if (local_320 != section) {
    cli.ManagedNativeHeader.VirtualAddress =
         offset_from_rva(local_320,pe_plus.OptionalHeader.DataDirectory[0xf].Size);
    __src_02 = byte_view::as<winmd::impl::image_cor20_header>
                         (&(this->m_view).super_byte_view,cli.ManagedNativeHeader.VirtualAddress);
    memcpy(local_390,__src_02,0x48);
    if (local_390[0] != 0x48) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3b0,"Invalid CLI header",&local_3b1);
      impl::throw_invalid(&local_3b0);
    }
    local_320 = section_from_rva(piStack_1d8,section,cli.cb);
    if (local_320 != section) {
      cli.ManagedNativeHeader.VirtualAddress = offset_from_rva(local_320,cli.cb);
      puVar8 = byte_view::as<unsigned_int>
                         (&(this->m_view).super_byte_view,cli.ManagedNativeHeader.VirtualAddress);
      if (*puVar8 != 0x424a5342) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&version_length,"CLI metadata magic signature not found",
                   (allocator<char> *)((long)&stream_count + 1));
        impl::throw_invalid((string *)&version_length);
      }
      puVar8 = byte_view::as<unsigned_int>
                         (&(this->m_view).super_byte_view,
                          cli.ManagedNativeHeader.VirtualAddress + 0xc);
      puVar9 = byte_view::as<unsigned_short>
                         (&(this->m_view).super_byte_view,
                          cli.ManagedNativeHeader.VirtualAddress + *puVar8 + 0x12);
      uVar1 = *puVar9;
      iVar2 = (int)this;
      byte_view::seek((byte_view *)&tables.m_last,iVar2 + 0x608);
      byte_view::byte_view((byte_view *)&stream.size);
      stream.offset._2_2_ = 0;
      do {
        if (uVar1 <= stream.offset._2_2_) {
          pbVar13 = byte_view::as<unsigned_char>((byte_view *)&stream.size,6);
          cppwinrt::std::bitset<8UL>::bitset
                    ((bitset<8UL> *)&stack0xfffffffffffffa88,(ulong)*pbVar13);
          bVar3 = cppwinrt::std::bitset<8UL>::test((bitset<8UL> *)&stack0xfffffffffffffa88,0);
          valid_bits.super__Base_bitset<1UL>._M_w._7_1_ = '\x02';
          if (bVar3) {
            valid_bits.super__Base_bitset<1UL>._M_w._7_1_ = '\x04';
          }
          bVar3 = cppwinrt::std::bitset<8UL>::test((bitset<8UL> *)&stack0xfffffffffffffa88,1);
          valid_bits.super__Base_bitset<1UL>._M_w._6_1_ = '\x02';
          if (bVar3) {
            valid_bits.super__Base_bitset<1UL>._M_w._6_1_ = '\x04';
          }
          bVar3 = cppwinrt::std::bitset<8UL>::test((bitset<8UL> *)&stack0xfffffffffffffa88,2);
          valid_bits.super__Base_bitset<1UL>._M_w._5_1_ = '\x02';
          if (bVar3) {
            valid_bits.super__Base_bitset<1UL>._M_w._5_1_ = '\x04';
          }
          puVar14 = byte_view::as<unsigned_long>((byte_view *)&stream.size,8);
          cppwinrt::std::bitset<64UL>::bitset(&local_588,*puVar14);
          byte_view::seek((byte_view *)&row_count,(int)&stream + 4);
          byte_view::operator=((byte_view *)&tables.m_last,(byte_view *)&row_count);
          for (local_59c = 0; local_59c < 0x40; local_59c = local_59c + 1) {
            bVar3 = cppwinrt::std::bitset<64UL>::test(&local_588,(ulong)local_59c);
            if (bVar3) {
              this_00 = &tables.m_last;
              puVar8 = byte_view::as<unsigned_int>((byte_view *)this_00,0);
              local_5a0 = *puVar8;
              byte_view::seek(&local_5b0,(uint32_t)this_00);
              byte_view::operator=((byte_view *)this_00,&local_5b0);
              switch(local_59c) {
              case 0:
                table_base::set_row_count(&(this->Module).super_table_base,local_5a0);
                break;
              case 1:
                table_base::set_row_count((table_base *)this,local_5a0);
                break;
              case 2:
                table_base::set_row_count(&(this->TypeDef).super_table_base,local_5a0);
                break;
              default:
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_5d0,"Unknown metadata table",
                           (allocator<char> *)&empty_table.field_0x27);
                impl::throw_invalid(&local_5d0);
              case 4:
                table_base::set_row_count(&(this->Field).super_table_base,local_5a0);
                break;
              case 6:
                table_base::set_row_count(&(this->MethodDef).super_table_base,local_5a0);
                break;
              case 8:
                table_base::set_row_count(&(this->Param).super_table_base,local_5a0);
                break;
              case 9:
                table_base::set_row_count(&(this->InterfaceImpl).super_table_base,local_5a0);
                break;
              case 10:
                table_base::set_row_count(&(this->MemberRef).super_table_base,local_5a0);
                break;
              case 0xb:
                table_base::set_row_count(&(this->Constant).super_table_base,local_5a0);
                break;
              case 0xc:
                table_base::set_row_count(&(this->CustomAttribute).super_table_base,local_5a0);
                break;
              case 0xd:
                table_base::set_row_count(&(this->FieldMarshal).super_table_base,local_5a0);
                break;
              case 0xe:
                table_base::set_row_count(&(this->DeclSecurity).super_table_base,local_5a0);
                break;
              case 0xf:
                table_base::set_row_count(&(this->ClassLayout).super_table_base,local_5a0);
                break;
              case 0x10:
                table_base::set_row_count(&(this->FieldLayout).super_table_base,local_5a0);
                break;
              case 0x11:
                table_base::set_row_count(&(this->StandAloneSig).super_table_base,local_5a0);
                break;
              case 0x12:
                table_base::set_row_count(&(this->EventMap).super_table_base,local_5a0);
                break;
              case 0x14:
                table_base::set_row_count(&(this->Event).super_table_base,local_5a0);
                break;
              case 0x15:
                table_base::set_row_count(&(this->PropertyMap).super_table_base,local_5a0);
                break;
              case 0x17:
                table_base::set_row_count(&(this->Property).super_table_base,local_5a0);
                break;
              case 0x18:
                table_base::set_row_count(&(this->MethodSemantics).super_table_base,local_5a0);
                break;
              case 0x19:
                table_base::set_row_count(&(this->MethodImpl).super_table_base,local_5a0);
                break;
              case 0x1a:
                table_base::set_row_count(&(this->ModuleRef).super_table_base,local_5a0);
                break;
              case 0x1b:
                table_base::set_row_count(&(this->TypeSpec).super_table_base,local_5a0);
                break;
              case 0x1c:
                table_base::set_row_count(&(this->ImplMap).super_table_base,local_5a0);
                break;
              case 0x1d:
                table_base::set_row_count(&(this->FieldRVA).super_table_base,local_5a0);
                break;
              case 0x20:
                table_base::set_row_count(&(this->Assembly).super_table_base,local_5a0);
                break;
              case 0x21:
                table_base::set_row_count(&(this->AssemblyProcessor).super_table_base,local_5a0);
                break;
              case 0x22:
                table_base::set_row_count(&(this->AssemblyOS).super_table_base,local_5a0);
                break;
              case 0x23:
                table_base::set_row_count(&(this->AssemblyRef).super_table_base,local_5a0);
                break;
              case 0x24:
                table_base::set_row_count(&(this->AssemblyRefProcessor).super_table_base,local_5a0);
                break;
              case 0x25:
                table_base::set_row_count(&(this->AssemblyRefOS).super_table_base,local_5a0);
                break;
              case 0x26:
                table_base::set_row_count(&(this->File).super_table_base,local_5a0);
                break;
              case 0x27:
                table_base::set_row_count(&(this->ExportedType).super_table_base,local_5a0);
                break;
              case 0x28:
                table_base::set_row_count(&(this->ManifestResource).super_table_base,local_5a0);
                break;
              case 0x29:
                table_base::set_row_count(&(this->NestedClass).super_table_base,local_5a0);
                break;
              case 0x2a:
                table_base::set_row_count(&(this->GenericParam).super_table_base,local_5a0);
                break;
              case 0x2b:
                table_base::set_row_count(&(this->MethodSpec).super_table_base,local_5a0);
                break;
              case 0x2c:
                table_base::set_row_count
                          (&(this->GenericParamConstraint).super_table_base,local_5a0);
              }
            }
          }
          table_base::table_base((table_base *)&MethodDefOrRef,(database *)0x0);
          c = composite_index_size<winmd::reader::table<winmd::reader::TypeDef>,winmd::reader::table<winmd::reader::TypeRef>,winmd::reader::table<winmd::reader::TypeSpec>>
                        (&this->TypeDef,&this->TypeRef,&this->TypeSpec);
          uVar4 = composite_index_size<winmd::reader::table<winmd::reader::Field>,winmd::reader::table<winmd::reader::Param>,winmd::reader::table<winmd::reader::Property>>
                            (&this->Field,&this->Param,&this->Property);
          uVar5 = composite_index_size<winmd::reader::table<winmd::reader::MethodDef>,winmd::reader::table<winmd::reader::Field>,winmd::reader::table<winmd::reader::TypeRef>,winmd::reader::table<winmd::reader::TypeDef>,winmd::reader::table<winmd::reader::Param>,winmd::reader::table<winmd::reader::InterfaceImpl>,winmd::reader::table<winmd::reader::MemberRef>,winmd::reader::table<winmd::reader::Module>,winmd::reader::table<winmd::reader::Property>,winmd::reader::table<winmd::reader::Event>,winmd::reader::table<winmd::reader::StandAloneSig>,winmd::reader::table<winmd::reader::ModuleRef>,winmd::reader::table<winmd::reader::TypeSpec>,winmd::reader::table<winmd::reader::Assembly>,winmd::reader::table<winmd::reader::AssemblyRef>,winmd::reader::table<winmd::reader::File>,winmd::reader::table<winmd::reader::ExportedType>,winmd::reader::table<winmd::reader::ManifestResource>,winmd::reader::table<winmd::reader::GenericParam>,winmd::reader::table<winmd::reader::GenericParamConstraint>,winmd::reader::table<winmd::reader::MethodSpec>>
                            (&this->MethodDef,&this->Field,&this->TypeRef,&this->TypeDef,
                             &this->Param,&this->InterfaceImpl,&this->MemberRef,&this->Module,
                             &this->Property,&this->Event,&this->StandAloneSig,&this->ModuleRef,
                             &this->TypeSpec,&this->Assembly,&this->AssemblyRef,&this->File,
                             &this->ExportedType,&this->ManifestResource,&this->GenericParam,
                             &this->GenericParamConstraint,&this->MethodSpec);
          uVar6 = composite_index_size<winmd::reader::table<winmd::reader::Field>,winmd::reader::table<winmd::reader::Param>>
                            (&this->Field,&this->Param);
          b = composite_index_size<winmd::reader::table<winmd::reader::TypeDef>,winmd::reader::table<winmd::reader::MethodDef>,winmd::reader::table<winmd::reader::Assembly>>
                        (&this->TypeDef,&this->MethodDef,&this->Assembly);
          a = composite_index_size<winmd::reader::table<winmd::reader::TypeDef>,winmd::reader::table<winmd::reader::TypeRef>,winmd::reader::table<winmd::reader::ModuleRef>,winmd::reader::table<winmd::reader::MethodDef>,winmd::reader::table<winmd::reader::TypeSpec>>
                        (&this->TypeDef,&this->TypeRef,&this->ModuleRef,&this->MethodDef,
                         &this->TypeSpec);
          c_00 = composite_index_size<winmd::reader::table<winmd::reader::Event>,winmd::reader::table<winmd::reader::Property>>
                           (&this->Event,&this->Property);
          a_00 = composite_index_size<winmd::reader::table<winmd::reader::MethodDef>,winmd::reader::table<winmd::reader::MemberRef>>
                           (&this->MethodDef,&this->MemberRef);
          b_00 = composite_index_size<winmd::reader::table<winmd::reader::Field>,winmd::reader::table<winmd::reader::MethodDef>>
                           (&this->Field,&this->MethodDef);
          e = composite_index_size<winmd::reader::table<winmd::reader::File>,winmd::reader::table<winmd::reader::AssemblyRef>,winmd::reader::table<winmd::reader::ExportedType>>
                        (&this->File,&this->AssemblyRef,&this->ExportedType);
          b_01 = composite_index_size<winmd::reader::table<winmd::reader::MethodDef>,winmd::reader::table<winmd::reader::MemberRef>,winmd::reader::table_base,winmd::reader::table_base,winmd::reader::table_base>
                           (&this->MethodDef,&this->MemberRef,(table_base *)&MethodDefOrRef,
                            (table_base *)&MethodDefOrRef,(table_base *)&MethodDefOrRef);
          a_01 = composite_index_size<winmd::reader::table<winmd::reader::Module>,winmd::reader::table<winmd::reader::ModuleRef>,winmd::reader::table<winmd::reader::AssemblyRef>,winmd::reader::table<winmd::reader::TypeRef>>
                           (&this->Module,&this->ModuleRef,&this->AssemblyRef,&this->TypeRef);
          c_01 = composite_index_size<winmd::reader::table<winmd::reader::TypeDef>,winmd::reader::table<winmd::reader::MethodDef>>
                           (&this->TypeDef,&this->MethodDef);
          table_base::set_columns
                    (&(this->Assembly).super_table_base,'\x04','\b','\x04',
                     valid_bits.super__Base_bitset<1UL>._M_w._5_1_,
                     valid_bits.super__Base_bitset<1UL>._M_w._7_1_,
                     valid_bits.super__Base_bitset<1UL>._M_w._7_1_);
          table_base::set_columns
                    (&(this->AssemblyOS).super_table_base,'\x04','\x04','\x04','\0','\0','\0');
          table_base::set_columns
                    (&(this->AssemblyProcessor).super_table_base,'\x04','\0','\0','\0','\0','\0');
          table_base::set_columns
                    (&(this->AssemblyRef).super_table_base,'\b','\x04',
                     valid_bits.super__Base_bitset<1UL>._M_w._5_1_,
                     valid_bits.super__Base_bitset<1UL>._M_w._7_1_,
                     valid_bits.super__Base_bitset<1UL>._M_w._7_1_,
                     valid_bits.super__Base_bitset<1UL>._M_w._5_1_);
          uVar7 = table_base::index_size(&(this->AssemblyRef).super_table_base);
          table_base::set_columns
                    (&(this->AssemblyRefOS).super_table_base,'\x04','\x04','\x04',uVar7,'\0','\0');
          uVar7 = table_base::index_size(&(this->AssemblyRef).super_table_base);
          table_base::set_columns
                    (&(this->AssemblyRefProcessor).super_table_base,'\x04',uVar7,'\0','\0','\0','\0'
                    );
          uVar7 = table_base::index_size(&(this->TypeDef).super_table_base);
          table_base::set_columns
                    (&(this->ClassLayout).super_table_base,'\x02','\x04',uVar7,'\0','\0','\0');
          table_base::set_columns
                    (&(this->Constant).super_table_base,'\x02',uVar4,
                     valid_bits.super__Base_bitset<1UL>._M_w._5_1_,'\0','\0','\0');
          table_base::set_columns
                    (&(this->CustomAttribute).super_table_base,uVar5,b_01,
                     valid_bits.super__Base_bitset<1UL>._M_w._5_1_,'\0','\0','\0');
          table_base::set_columns
                    (&(this->DeclSecurity).super_table_base,'\x02',b,
                     valid_bits.super__Base_bitset<1UL>._M_w._5_1_,'\0','\0','\0');
          uVar4 = table_base::index_size(&(this->TypeDef).super_table_base);
          uVar5 = table_base::index_size(&(this->Event).super_table_base);
          table_base::set_columns
                    (&(this->EventMap).super_table_base,uVar4,uVar5,'\0','\0','\0','\0');
          table_base::set_columns
                    (&(this->Event).super_table_base,'\x02',
                     valid_bits.super__Base_bitset<1UL>._M_w._7_1_,c,'\0','\0','\0');
          table_base::set_columns
                    (&(this->ExportedType).super_table_base,'\x04','\x04',
                     valid_bits.super__Base_bitset<1UL>._M_w._7_1_,
                     valid_bits.super__Base_bitset<1UL>._M_w._7_1_,e,'\0');
          table_base::set_columns
                    (&(this->Field).super_table_base,'\x02',
                     valid_bits.super__Base_bitset<1UL>._M_w._7_1_,
                     valid_bits.super__Base_bitset<1UL>._M_w._5_1_,'\0','\0','\0');
          uVar4 = table_base::index_size(&(this->Field).super_table_base);
          table_base::set_columns
                    (&(this->FieldLayout).super_table_base,'\x04',uVar4,'\0','\0','\0','\0');
          table_base::set_columns
                    (&(this->FieldMarshal).super_table_base,uVar6,
                     valid_bits.super__Base_bitset<1UL>._M_w._5_1_,'\0','\0','\0','\0');
          uVar4 = table_base::index_size(&(this->Field).super_table_base);
          table_base::set_columns
                    (&(this->FieldRVA).super_table_base,'\x04',uVar4,'\0','\0','\0','\0');
          table_base::set_columns
                    (&(this->File).super_table_base,'\x04',
                     valid_bits.super__Base_bitset<1UL>._M_w._7_1_,
                     valid_bits.super__Base_bitset<1UL>._M_w._5_1_,'\0','\0','\0');
          table_base::set_columns
                    (&(this->GenericParam).super_table_base,'\x02','\x02',c_01,
                     valid_bits.super__Base_bitset<1UL>._M_w._7_1_,'\0','\0');
          uVar4 = table_base::index_size(&(this->GenericParam).super_table_base);
          table_base::set_columns
                    (&(this->GenericParamConstraint).super_table_base,uVar4,c,'\0','\0','\0','\0');
          uVar4 = valid_bits.super__Base_bitset<1UL>._M_w._7_1_;
          uVar5 = table_base::index_size(&(this->ModuleRef).super_table_base);
          table_base::set_columns
                    (&(this->ImplMap).super_table_base,'\x02',b_00,uVar4,uVar5,'\0','\0');
          uVar4 = table_base::index_size(&(this->TypeDef).super_table_base);
          table_base::set_columns
                    (&(this->InterfaceImpl).super_table_base,uVar4,c,'\0','\0','\0','\0');
          table_base::set_columns
                    (&(this->ManifestResource).super_table_base,'\x04','\x04',
                     valid_bits.super__Base_bitset<1UL>._M_w._7_1_,e,'\0','\0');
          table_base::set_columns
                    (&(this->MemberRef).super_table_base,a,
                     valid_bits.super__Base_bitset<1UL>._M_w._7_1_,
                     valid_bits.super__Base_bitset<1UL>._M_w._5_1_,'\0','\0','\0');
          uVar5 = valid_bits.super__Base_bitset<1UL>._M_w._7_1_;
          uVar4 = valid_bits.super__Base_bitset<1UL>._M_w._5_1_;
          uVar6 = table_base::index_size(&(this->Param).super_table_base);
          table_base::set_columns
                    (&(this->MethodDef).super_table_base,'\x04','\x02','\x02',uVar5,uVar4,uVar6);
          uVar4 = table_base::index_size(&(this->TypeDef).super_table_base);
          table_base::set_columns
                    (&(this->MethodImpl).super_table_base,uVar4,a_00,a_00,'\0','\0','\0');
          uVar4 = table_base::index_size(&(this->MethodDef).super_table_base);
          table_base::set_columns
                    (&(this->MethodSemantics).super_table_base,'\x02',uVar4,c_00,'\0','\0','\0');
          table_base::set_columns
                    (&(this->MethodSpec).super_table_base,a_00,
                     valid_bits.super__Base_bitset<1UL>._M_w._5_1_,'\0','\0','\0','\0');
          table_base::set_columns
                    (&(this->Module).super_table_base,'\x02',
                     valid_bits.super__Base_bitset<1UL>._M_w._7_1_,
                     valid_bits.super__Base_bitset<1UL>._M_w._6_1_,
                     valid_bits.super__Base_bitset<1UL>._M_w._6_1_,
                     valid_bits.super__Base_bitset<1UL>._M_w._6_1_,'\0');
          table_base::set_columns
                    (&(this->ModuleRef).super_table_base,
                     valid_bits.super__Base_bitset<1UL>._M_w._7_1_,'\0','\0','\0','\0','\0');
          uVar4 = table_base::index_size(&(this->TypeDef).super_table_base);
          uVar5 = table_base::index_size(&(this->TypeDef).super_table_base);
          table_base::set_columns
                    (&(this->NestedClass).super_table_base,uVar4,uVar5,'\0','\0','\0','\0');
          table_base::set_columns
                    (&(this->Param).super_table_base,'\x02','\x02',
                     valid_bits.super__Base_bitset<1UL>._M_w._7_1_,'\0','\0','\0');
          table_base::set_columns
                    (&(this->Property).super_table_base,'\x02',
                     valid_bits.super__Base_bitset<1UL>._M_w._7_1_,
                     valid_bits.super__Base_bitset<1UL>._M_w._5_1_,'\0','\0','\0');
          uVar4 = table_base::index_size(&(this->TypeDef).super_table_base);
          uVar5 = table_base::index_size(&(this->Property).super_table_base);
          table_base::set_columns
                    (&(this->PropertyMap).super_table_base,uVar4,uVar5,'\0','\0','\0','\0');
          table_base::set_columns
                    (&(this->StandAloneSig).super_table_base,
                     valid_bits.super__Base_bitset<1UL>._M_w._5_1_,'\0','\0','\0','\0','\0');
          uVar4 = valid_bits.super__Base_bitset<1UL>._M_w._7_1_;
          uVar5 = table_base::index_size(&(this->Field).super_table_base);
          uVar6 = table_base::index_size(&(this->MethodDef).super_table_base);
          table_base::set_columns
                    (&(this->TypeDef).super_table_base,'\x04',uVar4,uVar4,c,uVar5,uVar6);
          table_base::set_columns
                    ((table_base *)this,a_01,valid_bits.super__Base_bitset<1UL>._M_w._7_1_,
                     valid_bits.super__Base_bitset<1UL>._M_w._7_1_,'\0','\0','\0');
          table_base::set_columns
                    (&(this->TypeSpec).super_table_base,
                     valid_bits.super__Base_bitset<1UL>._M_w._5_1_,'\0','\0','\0','\0','\0');
          table_base::set_data(&(this->Module).super_table_base,(byte_view *)&tables.m_last);
          table_base::set_data((table_base *)this,(byte_view *)&tables.m_last);
          table_base::set_data(&(this->TypeDef).super_table_base,(byte_view *)&tables.m_last);
          table_base::set_data(&(this->Field).super_table_base,(byte_view *)&tables.m_last);
          table_base::set_data(&(this->MethodDef).super_table_base,(byte_view *)&tables.m_last);
          table_base::set_data(&(this->Param).super_table_base,(byte_view *)&tables.m_last);
          table_base::set_data(&(this->InterfaceImpl).super_table_base,(byte_view *)&tables.m_last);
          table_base::set_data(&(this->MemberRef).super_table_base,(byte_view *)&tables.m_last);
          table_base::set_data(&(this->Constant).super_table_base,(byte_view *)&tables.m_last);
          table_base::set_data
                    (&(this->CustomAttribute).super_table_base,(byte_view *)&tables.m_last);
          table_base::set_data(&(this->FieldMarshal).super_table_base,(byte_view *)&tables.m_last);
          table_base::set_data(&(this->DeclSecurity).super_table_base,(byte_view *)&tables.m_last);
          table_base::set_data(&(this->ClassLayout).super_table_base,(byte_view *)&tables.m_last);
          table_base::set_data(&(this->FieldLayout).super_table_base,(byte_view *)&tables.m_last);
          table_base::set_data(&(this->StandAloneSig).super_table_base,(byte_view *)&tables.m_last);
          table_base::set_data(&(this->EventMap).super_table_base,(byte_view *)&tables.m_last);
          table_base::set_data(&(this->Event).super_table_base,(byte_view *)&tables.m_last);
          table_base::set_data(&(this->PropertyMap).super_table_base,(byte_view *)&tables.m_last);
          table_base::set_data(&(this->Property).super_table_base,(byte_view *)&tables.m_last);
          table_base::set_data
                    (&(this->MethodSemantics).super_table_base,(byte_view *)&tables.m_last);
          table_base::set_data(&(this->MethodImpl).super_table_base,(byte_view *)&tables.m_last);
          table_base::set_data(&(this->ModuleRef).super_table_base,(byte_view *)&tables.m_last);
          table_base::set_data(&(this->TypeSpec).super_table_base,(byte_view *)&tables.m_last);
          table_base::set_data(&(this->ImplMap).super_table_base,(byte_view *)&tables.m_last);
          table_base::set_data(&(this->FieldRVA).super_table_base,(byte_view *)&tables.m_last);
          table_base::set_data(&(this->Assembly).super_table_base,(byte_view *)&tables.m_last);
          table_base::set_data
                    (&(this->AssemblyProcessor).super_table_base,(byte_view *)&tables.m_last);
          table_base::set_data(&(this->AssemblyOS).super_table_base,(byte_view *)&tables.m_last);
          table_base::set_data(&(this->AssemblyRef).super_table_base,(byte_view *)&tables.m_last);
          table_base::set_data
                    (&(this->AssemblyRefProcessor).super_table_base,(byte_view *)&tables.m_last);
          table_base::set_data(&(this->AssemblyRefOS).super_table_base,(byte_view *)&tables.m_last);
          table_base::set_data(&(this->File).super_table_base,(byte_view *)&tables.m_last);
          table_base::set_data(&(this->ExportedType).super_table_base,(byte_view *)&tables.m_last);
          table_base::set_data
                    (&(this->ManifestResource).super_table_base,(byte_view *)&tables.m_last);
          table_base::set_data(&(this->NestedClass).super_table_base,(byte_view *)&tables.m_last);
          table_base::set_data(&(this->GenericParam).super_table_base,(byte_view *)&tables.m_last);
          table_base::set_data(&(this->MethodSpec).super_table_base,(byte_view *)&tables.m_last);
          table_base::set_data
                    (&(this->GenericParamConstraint).super_table_base,(byte_view *)&tables.m_last);
          return;
        }
        psVar10 = byte_view::as<winmd::reader::database::stream_range>
                            ((byte_view *)&tables.m_last,0);
        name._M_elems._4_8_ = *psVar10;
        paVar11 = byte_view::as<std::array<char,12ul>>((byte_view *)&tables.m_last,8);
        local_448 = *(undefined1 (*) [8])paVar11->_M_elems;
        name._M_elems._0_4_ = *(undefined4 *)(paVar11->_M_elems + 8);
        pvVar12 = cppwinrt::std::array<char,_12UL>::data((array<char,_12UL> *)local_448);
        cppwinrt::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_458,pvVar12);
        local_468 = sv("#Strings",8);
        bVar3 = std::operator==(local_458,local_468);
        if (bVar3) {
          byte_view::sub(&local_478,iVar2 + 0x608,
                         cli.ManagedNativeHeader.VirtualAddress + name._M_elems._4_4_);
          byte_view::operator=(&this->m_strings,&local_478);
        }
        else {
          pvVar12 = cppwinrt::std::array<char,_12UL>::data((array<char,_12UL> *)local_448);
          cppwinrt::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_488,pvVar12);
          local_498 = sv("#Blob",5);
          bVar3 = std::operator==(local_488,local_498);
          if (bVar3) {
            byte_view::sub(&local_4a8,iVar2 + 0x608,
                           cli.ManagedNativeHeader.VirtualAddress + name._M_elems._4_4_);
            byte_view::operator=(&this->m_blobs,&local_4a8);
          }
          else {
            pvVar12 = cppwinrt::std::array<char,_12UL>::data((array<char,_12UL> *)local_448);
            cppwinrt::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_4b8,pvVar12);
            local_4c8 = sv("#GUID",5);
            bVar3 = std::operator==(local_4b8,local_4c8);
            if (bVar3) {
              byte_view::sub(&local_4d8,iVar2 + 0x608,
                             cli.ManagedNativeHeader.VirtualAddress + name._M_elems._4_4_);
              byte_view::operator=(&this->m_guids,&local_4d8);
            }
            else {
              pvVar12 = cppwinrt::std::array<char,_12UL>::data((array<char,_12UL> *)local_448);
              cppwinrt::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (&local_4e8,pvVar12);
              local_4f8 = sv("#~",2);
              bVar3 = std::operator==(local_4e8,local_4f8);
              if (bVar3) {
                byte_view::sub(&local_508,iVar2 + 0x608,
                               cli.ManagedNativeHeader.VirtualAddress + name._M_elems._4_4_);
                byte_view::operator=((byte_view *)&stream.size,&local_508);
              }
              else {
                pvVar12 = cppwinrt::std::array<char,_12UL>::data((array<char,_12UL> *)local_448);
                cppwinrt::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          (&local_518,pvVar12);
                local_528 = sv("#US",3);
                bVar3 = std::operator!=(local_518,local_528);
                if (bVar3) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_548,"Unknown metadata stream",&local_549);
                  impl::throw_invalid(&local_548);
                }
              }
            }
          }
        }
        pvVar12 = cppwinrt::std::array<char,_12UL>::data((array<char,_12UL> *)local_448);
        cppwinrt::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&heap_sizes,pvVar12);
        stream_offset((string_view *)&heap_sizes);
        byte_view::seek(&local_560,(int)&tables + 8);
        byte_view::operator=((byte_view *)&tables.m_last,&local_560);
        stream.offset._2_2_ = stream.offset._2_2_ + 1;
      } while( true );
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3d8,"PE section containing CLI metadata not found",&local_3d9);
    impl::throw_invalid(&local_3d8);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&offset,"PE section containing CLI header not found",
             (allocator<char> *)((long)&cli.ManagedNativeHeader.Size + 3));
  impl::throw_invalid((string *)&offset);
}

Assistant:

void initialize()
        {
            auto dos = m_view.as<impl::image_dos_header>();

            if (dos.e_signature != 0x5A4D) // IMAGE_DOS_SIGNATURE
            {
                impl::throw_invalid("Invalid DOS signature");
            }

            auto pe = m_view.as<impl::image_nt_headers32>(dos.e_lfanew);

            if (pe.FileHeader.NumberOfSections == 0 || pe.FileHeader.NumberOfSections > 100)
            {
                impl::throw_invalid("Invalid PE section count");
            }

            impl::image_section_header const* sections{};
            uint32_t com_virtual_address{};
            if (pe.OptionalHeader.Magic == 0x10B) // PE32
            {
                com_virtual_address = pe.OptionalHeader.DataDirectory[14].VirtualAddress; // IMAGE_DIRECTORY_ENTRY_COM_DESCRIPTOR
                sections = &m_view.as<impl::image_section_header>(dos.e_lfanew + sizeof(impl::image_nt_headers32));
            }
            else if (pe.OptionalHeader.Magic == 0x20B) // PE32+
            {
                auto pe_plus = m_view.as<impl::image_nt_headers32plus>(dos.e_lfanew);
                com_virtual_address = pe_plus.OptionalHeader.DataDirectory[14].VirtualAddress; // IMAGE_DIRECTORY_ENTRY_COM_DESCRIPTOR
                sections = &m_view.as<impl::image_section_header>(dos.e_lfanew + sizeof(impl::image_nt_headers32plus));
            }
            else
            {
                impl::throw_invalid("Invalid optional header magic value");
            }
            auto sections_end = sections + pe.FileHeader.NumberOfSections;
            auto section = section_from_rva(sections, sections_end, com_virtual_address);

            if (section == sections_end)
            {
                impl::throw_invalid("PE section containing CLI header not found");
            }

            auto offset = offset_from_rva(*section, com_virtual_address);

            auto cli = m_view.as<impl::image_cor20_header>(offset);

            if (cli.cb != sizeof(impl::image_cor20_header))
            {
                impl::throw_invalid("Invalid CLI header");
            }

            section = section_from_rva(sections, sections_end, cli.MetaData.VirtualAddress);

            if (section == sections_end)
            {
                impl::throw_invalid("PE section containing CLI metadata not found");
            }

            offset = offset_from_rva(*section, cli.MetaData.VirtualAddress);

            if (m_view.as<uint32_t>(offset) != 0x424a5342)
            {
                impl::throw_invalid("CLI metadata magic signature not found");
            }

            auto version_length = m_view.as<uint32_t>(offset + 12);
            auto stream_count = m_view.as<uint16_t>(offset + version_length + 18);
            auto view = m_view.seek(offset + version_length + 20);
            byte_view tables;

            for (uint16_t i{}; i < stream_count; ++i)
            {
                auto stream = view.as<stream_range>();
                auto name = view.as<std::array<char, 12>>(8);

                if (name.data() == "#Strings"sv)
                {
                    m_strings = m_view.sub(offset + stream.offset, stream.size);
                }
                else if (name.data() == "#Blob"sv)
                {
                    m_blobs = m_view.sub(offset + stream.offset, stream.size);
                }
                else if (name.data() == "#GUID"sv)
                {
                    m_guids = m_view.sub(offset + stream.offset, stream.size);
                }
                else if (name.data() == "#~"sv)
                {
                    tables = m_view.sub(offset + stream.offset, stream.size);
                }
                else if (name.data() != "#US"sv)
                {
                    impl::throw_invalid("Unknown metadata stream");
                }

                view = view.seek(stream_offset(name.data()));
            }

            std::bitset<8> const heap_sizes{ tables.as<uint8_t>(6) };
            uint8_t const string_index_size = heap_sizes.test(0) ? 4 : 2;
            uint8_t const guid_index_size = heap_sizes.test(1) ? 4 : 2;
            uint8_t const blob_index_size = heap_sizes.test(2) ? 4 : 2;

            std::bitset<64> const valid_bits{ tables.as<uint64_t>(8) };
            view = tables.seek(24);

            for (uint32_t i{}; i < 64; ++i)
            {
                if (!valid_bits.test(i))
                {
                    continue;
                }

                auto row_count = view.as<uint32_t>();
                view = view.seek(4);

                switch (i)
                {
                case 0x00: Module.set_row_count(row_count); break;
                case 0x01: TypeRef.set_row_count(row_count); break;
                case 0x02: TypeDef.set_row_count(row_count); break;
                case 0x04: Field.set_row_count(row_count); break;
                case 0x06: MethodDef.set_row_count(row_count); break;
                case 0x08: Param.set_row_count(row_count); break;
                case 0x09: InterfaceImpl.set_row_count(row_count); break;
                case 0x0a: MemberRef.set_row_count(row_count); break;
                case 0x0b: Constant.set_row_count(row_count); break;
                case 0x0c: CustomAttribute.set_row_count(row_count); break;
                case 0x0d: FieldMarshal.set_row_count(row_count); break;
                case 0x0e: DeclSecurity.set_row_count(row_count); break;
                case 0x0f: ClassLayout.set_row_count(row_count); break;
                case 0x10: FieldLayout.set_row_count(row_count); break;
                case 0x11: StandAloneSig.set_row_count(row_count); break;
                case 0x12: EventMap.set_row_count(row_count); break;
                case 0x14: Event.set_row_count(row_count); break;
                case 0x15: PropertyMap.set_row_count(row_count); break;
                case 0x17: Property.set_row_count(row_count); break;
                case 0x18: MethodSemantics.set_row_count(row_count); break;
                case 0x19: MethodImpl.set_row_count(row_count); break;
                case 0x1a: ModuleRef.set_row_count(row_count); break;
                case 0x1b: TypeSpec.set_row_count(row_count); break;
                case 0x1c: ImplMap.set_row_count(row_count); break;
                case 0x1d: FieldRVA.set_row_count(row_count); break;
                case 0x20: Assembly.set_row_count(row_count); break;
                case 0x21: AssemblyProcessor.set_row_count(row_count); break;
                case 0x22: AssemblyOS.set_row_count(row_count); break;
                case 0x23: AssemblyRef.set_row_count(row_count); break;
                case 0x24: AssemblyRefProcessor.set_row_count(row_count); break;
                case 0x25: AssemblyRefOS.set_row_count(row_count); break;
                case 0x26: File.set_row_count(row_count); break;
                case 0x27: ExportedType.set_row_count(row_count); break;
                case 0x28: ManifestResource.set_row_count(row_count); break;
                case 0x29: NestedClass.set_row_count(row_count); break;
                case 0x2a: GenericParam.set_row_count(row_count); break;
                case 0x2b: MethodSpec.set_row_count(row_count); break;
                case 0x2c: GenericParamConstraint.set_row_count(row_count); break;
                default: impl::throw_invalid("Unknown metadata table");
                };
            }

            table_base const empty_table{ nullptr };

            auto const TypeDefOrRef = composite_index_size(TypeDef, TypeRef, TypeSpec);
            auto const HasConstant = composite_index_size(Field, Param, Property);
            auto const HasCustomAttribute = composite_index_size(MethodDef, Field, TypeRef, TypeDef, Param, InterfaceImpl, MemberRef, Module, Property, Event, StandAloneSig, ModuleRef, TypeSpec, Assembly, AssemblyRef, File, ExportedType, ManifestResource, GenericParam, GenericParamConstraint, MethodSpec);
            auto const HasFieldMarshal = composite_index_size(Field, Param);
            auto const HasDeclSecurity = composite_index_size(TypeDef, MethodDef, Assembly);
            auto const MemberRefParent = composite_index_size(TypeDef, TypeRef, ModuleRef, MethodDef, TypeSpec);
            auto const HasSemantics = composite_index_size(Event, Property);
            auto const MethodDefOrRef = composite_index_size(MethodDef, MemberRef);
            auto const MemberForwarded = composite_index_size(Field, MethodDef);
            auto const Implementation = composite_index_size(File, AssemblyRef, ExportedType);
            auto const CustomAttributeType = composite_index_size(MethodDef, MemberRef, empty_table, empty_table, empty_table);
            auto const ResolutionScope = composite_index_size(Module, ModuleRef, AssemblyRef, TypeRef);
            auto const TypeOrMethodDef = composite_index_size(TypeDef, MethodDef);

            Assembly.set_columns(4, 8, 4, blob_index_size, string_index_size, string_index_size);
            AssemblyOS.set_columns(4, 4, 4);
            AssemblyProcessor.set_columns(4);
            AssemblyRef.set_columns(8, 4, blob_index_size, string_index_size, string_index_size, blob_index_size);
            AssemblyRefOS.set_columns(4, 4, 4, AssemblyRef.index_size());
            AssemblyRefProcessor.set_columns(4, AssemblyRef.index_size());
            ClassLayout.set_columns(2, 4, TypeDef.index_size());
            Constant.set_columns(2, HasConstant, blob_index_size);
            CustomAttribute.set_columns(HasCustomAttribute, CustomAttributeType, blob_index_size);
            DeclSecurity.set_columns(2, HasDeclSecurity, blob_index_size);
            EventMap.set_columns(TypeDef.index_size(), Event.index_size());
            Event.set_columns(2, string_index_size, TypeDefOrRef);
            ExportedType.set_columns(4, 4, string_index_size, string_index_size, Implementation);
            Field.set_columns(2, string_index_size, blob_index_size);
            FieldLayout.set_columns(4, Field.index_size());
            FieldMarshal.set_columns(HasFieldMarshal, blob_index_size);
            FieldRVA.set_columns(4, Field.index_size());
            File.set_columns(4, string_index_size, blob_index_size);
            GenericParam.set_columns(2, 2, TypeOrMethodDef, string_index_size);
            GenericParamConstraint.set_columns(GenericParam.index_size(), TypeDefOrRef);
            ImplMap.set_columns(2, MemberForwarded, string_index_size, ModuleRef.index_size());
            InterfaceImpl.set_columns(TypeDef.index_size(), TypeDefOrRef);
            ManifestResource.set_columns(4, 4, string_index_size, Implementation);
            MemberRef.set_columns(MemberRefParent, string_index_size, blob_index_size);
            MethodDef.set_columns(4, 2, 2, string_index_size, blob_index_size, Param.index_size());
            MethodImpl.set_columns(TypeDef.index_size(), MethodDefOrRef, MethodDefOrRef);
            MethodSemantics.set_columns(2, MethodDef.index_size(), HasSemantics);
            MethodSpec.set_columns(MethodDefOrRef, blob_index_size);
            Module.set_columns(2, string_index_size, guid_index_size, guid_index_size, guid_index_size);
            ModuleRef.set_columns(string_index_size);
            NestedClass.set_columns(TypeDef.index_size(), TypeDef.index_size());
            Param.set_columns(2, 2, string_index_size);
            Property.set_columns(2, string_index_size, blob_index_size);
            PropertyMap.set_columns(TypeDef.index_size(), Property.index_size());
            StandAloneSig.set_columns(blob_index_size);
            TypeDef.set_columns(4, string_index_size, string_index_size, TypeDefOrRef, Field.index_size(), MethodDef.index_size());
            TypeRef.set_columns(ResolutionScope, string_index_size, string_index_size);
            TypeSpec.set_columns(blob_index_size);

            Module.set_data(view);
            TypeRef.set_data(view);
            TypeDef.set_data(view);
            Field.set_data(view);
            MethodDef.set_data(view);
            Param.set_data(view);
            InterfaceImpl.set_data(view);
            MemberRef.set_data(view);
            Constant.set_data(view);
            CustomAttribute.set_data(view);
            FieldMarshal.set_data(view);
            DeclSecurity.set_data(view);
            ClassLayout.set_data(view);
            FieldLayout.set_data(view);
            StandAloneSig.set_data(view);
            EventMap.set_data(view);
            Event.set_data(view);
            PropertyMap.set_data(view);
            Property.set_data(view);
            MethodSemantics.set_data(view);
            MethodImpl.set_data(view);
            ModuleRef.set_data(view);
            TypeSpec.set_data(view);
            ImplMap.set_data(view);
            FieldRVA.set_data(view);
            Assembly.set_data(view);
            AssemblyProcessor.set_data(view);
            AssemblyOS.set_data(view);
            AssemblyRef.set_data(view);
            AssemblyRefProcessor.set_data(view);
            AssemblyRefOS.set_data(view);
            File.set_data(view);
            ExportedType.set_data(view);
            ManifestResource.set_data(view);
            NestedClass.set_data(view);
            GenericParam.set_data(view);
            MethodSpec.set_data(view);
            GenericParamConstraint.set_data(view);
        }